

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

bool __thiscall aiMetadata::HasKey(aiMetadata *this,char *key)

{
  int iVar1;
  bool bVar2;
  char *__s1;
  long lVar3;
  
  if (key == (char *)0x0) {
    bVar2 = false;
  }
  else {
    lVar3 = (ulong)this->mNumProperties + 1;
    __s1 = this->mKeys->data;
    do {
      lVar3 = lVar3 + -1;
      bVar2 = lVar3 != 0;
      if (lVar3 == 0) {
        return bVar2;
      }
      iVar1 = strncmp(__s1,key,(ulong)((aiString *)(__s1 + -4))->length);
      __s1 = __s1 + 0x404;
    } while (iVar1 != 0);
  }
  return bVar2;
}

Assistant:

inline
    bool HasKey(const char* key) {
        if ( nullptr == key ) {
            return false;
        }
        
        // Search for the given key
        for (unsigned int i = 0; i < mNumProperties; ++i) {
            if ( 0 == strncmp(mKeys[i].C_Str(), key, mKeys[i].length ) ) {
                return true;
            }
        }
        return false;
    }